

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsinput.cpp
# Opt level: O1

bool __thiscall soplex::MPSInput::readLine(MPSInput *this)

{
  char **ppcVar1;
  char **ppcVar2;
  char **ppcVar3;
  byte bVar4;
  istream *piVar5;
  int iVar6;
  long *plVar7;
  size_t sVar8;
  char *pcVar9;
  char **ppcVar10;
  char *pcVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  
  ppcVar1 = &this->m_f5;
  ppcVar2 = &this->m_f4;
  ppcVar3 = &this->m_f3;
  pcVar11 = this->m_buf;
  do {
    this->m_f4 = (char *)0x0;
    this->m_f5 = (char *)0x0;
    this->m_f2 = (char *)0x0;
    this->m_f3 = (char *)0x0;
    this->m_f0 = (char *)0x0;
    this->m_f1 = (char *)0x0;
    do {
      do {
        do {
          piVar5 = this->m_input;
          std::ios::widen((char)piVar5->_vptr_basic_istream[-3] + (char)piVar5);
          plVar7 = (long *)std::istream::getline((char *)piVar5,(long)pcVar11,'\0');
          if ((*(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) != 0) &&
             (((&this->m_input->field_0x20)[(long)this->m_input->_vptr_basic_istream[-3]] & 2) == 0)
             ) {
            return false;
          }
          this->m_lineno = this->m_lineno + 1;
        } while (this->m_buf[0] == '*');
        sVar8 = strlen(pcVar11);
      } while ((int)(uint)sVar8 < 1);
      bVar13 = true;
      uVar12 = 0;
      do {
        bVar4 = pcVar11[uVar12];
        if (bVar4 - 9 < 2) {
LAB_001719cf:
          pcVar11[uVar12] = ' ';
        }
        else if (bVar4 != 0x20) {
          if (bVar4 == 0xd) goto LAB_001719cf;
          bVar13 = false;
        }
        uVar12 = uVar12 + 1;
      } while (((uint)sVar8 & 0x7fffffff) != uVar12);
    } while (bVar13);
    sVar8 = strlen(pcVar11);
    iVar6 = (int)sVar8;
    if (iVar6 < 0x50) {
      memset(pcVar11 + iVar6,0x20,(ulong)(0x4f - iVar6) + 1);
      this->m_buf[0x50] = '\0';
    }
    if (*pcVar11 != ' ') {
      pcVar11 = strtok(pcVar11," ");
      this->m_f0 = pcVar11;
      pcVar11 = strtok((char *)0x0," ");
      this->m_f1 = pcVar11;
      return true;
    }
    if (this->m_is_new_format == false) {
      if (this->m_buf[0xd] == 0x20 && this->m_buf[0xe] == '$') {
        builtin_strncpy(this->m_buf + 0xe,
                        "                                                                  ",0x42);
LAB_00171a8b:
        this->m_buf[0x50] = '\0';
      }
      else if ((this->m_buf[0x27] == '$') && (this->m_buf[0x26] == ' ')) {
        builtin_strncpy(this->m_buf + 0x27,"                                         ",0x29);
        goto LAB_00171a8b;
      }
      if ((iVar6 < 0xd) ||
         ((byte)(this->m_buf[0xc] | this->m_buf[0x16] | this->m_buf[0x17] | this->m_buf[0x24] |
                 this->m_buf[0x25] | this->m_buf[0x26] | this->m_buf[0x2f] | this->m_buf[0x30] |
                 this->m_buf[0x3d] | this->m_buf[0x3e] | this->m_buf[0x3f] | this->m_buf[0xd]) ==
          0x20)) {
        bVar13 = true;
        if ((((9 < (int)this->m_buf[0x18] - 0x30U) &&
             ((((9 < (int)this->m_buf[0x19] - 0x30U && (9 < (int)this->m_buf[0x1a] - 0x30U)) &&
               (9 < (int)this->m_buf[0x1b] - 0x30U)) &&
              ((9 < (int)this->m_buf[0x1c] - 0x30U && (9 < (int)this->m_buf[0x1d] - 0x30U)))))) &&
            (9 < (int)this->m_buf[0x1e] - 0x30U)) &&
           (((9 < (int)this->m_buf[0x1f] - 0x30U && (9 < (int)this->m_buf[0x20] - 0x30U)) &&
            ((9 < (int)this->m_buf[0x21] - 0x30U && (9 < (int)this->m_buf[0x22] - 0x30U)))))) {
          bVar13 = (int)this->m_buf[0x23] - 0x30U < 10;
        }
        if ((iVar6 < 0xd) || (bVar13)) {
          patch_field(pcVar11,4,0xc);
          patch_field(pcVar11,0xe,0x16);
          patch_field(pcVar11,0x27,0x2f);
        }
        else if ((this->m_section & ~ROWS) == COLUMNS) goto LAB_00171abc;
      }
      else {
LAB_00171abc:
        this->m_is_new_format = true;
      }
    }
    pcVar9 = strtok(this->m_buf + 1," ");
    this->m_f1 = pcVar9;
    bVar13 = false;
    if (pcVar9 != (char *)0x0) {
      pcVar9 = strtok((char *)0x0," ");
      this->m_f2 = pcVar9;
      if ((pcVar9 == (char *)0x0) || (*pcVar9 == '$')) {
        ppcVar10 = &this->m_f2;
        bVar13 = false;
      }
      else {
        iVar6 = strcmp(pcVar9,"\'MARKER\'");
        bVar14 = iVar6 == 0;
        pcVar9 = strtok((char *)0x0," ");
        *ppcVar3 = pcVar9;
        ppcVar10 = ppcVar3;
        bVar13 = bVar14;
        if ((pcVar9 != (char *)0x0) && (*pcVar9 != '$')) {
          if (iVar6 == 0) {
            iVar6 = strcmp(pcVar9,"\'INTORG\'");
            if (iVar6 == 0) {
              this->m_is_integer = true;
            }
            else {
              iVar6 = strcmp(pcVar9,"\'INTEND\'");
              if (iVar6 != 0) goto LAB_00171cff;
              this->m_is_integer = false;
            }
          }
          iVar6 = strcmp(pcVar9,"\'MARKER\'");
          bVar13 = iVar6 == 0 || bVar14;
          pcVar9 = strtok((char *)0x0," ");
          *ppcVar2 = pcVar9;
          ppcVar10 = ppcVar2;
          if ((pcVar9 != (char *)0x0) && (*pcVar9 != '$')) {
            if (iVar6 == 0 || bVar14) {
              iVar6 = strcmp(pcVar9,"\'INTORG\'");
              if (iVar6 == 0) {
                this->m_is_integer = true;
              }
              else {
                iVar6 = strcmp(pcVar9,"\'INTEND\'");
                if (iVar6 != 0) goto LAB_00171cff;
                this->m_is_integer = false;
              }
            }
            pcVar9 = strtok((char *)0x0," ");
            *ppcVar1 = pcVar9;
            ppcVar10 = ppcVar1;
            if ((pcVar9 != (char *)0x0) && (*pcVar9 != '$')) goto LAB_00171cff;
          }
        }
      }
      *ppcVar10 = (char *)0x0;
    }
LAB_00171cff:
    if (!bVar13) {
      return true;
    }
  } while( true );
}

Assistant:

bool MPSInput::readLine()
{
   int   len;
   int   space;
   char* s;
   bool  is_marker;
   bool  is_comment;

   do
   {
      m_f0 = m_f1 = m_f2 = m_f3 = m_f4 = m_f5 = nullptr;
      is_marker = false;

      // Read until we have a non-empty, non-comment line.
      do
      {
         if(!m_input.getline(m_buf, sizeof(m_buf)).good() && !m_input.eof())
            return false;

         m_lineno++;

         SPxOut::debug(this, "DMPSIN01 Line {} {}\n", m_lineno, m_buf);

         /* check if comment line */
         is_comment = true;

         if(m_buf[0] == '*')
            continue;

         /* normalize line and check if it is empty */
         len = int(strlen(m_buf));

         for(int i = 0; i < len; i++)
         {
            if(m_buf[i] == '\t' || m_buf[i] == '\n' || m_buf[i] == '\r')
               m_buf[i] = BLANK;
            else if(m_buf[i] != BLANK)
               is_comment = false;
         }
      }
      while(is_comment);

      len = int(strlen(m_buf));

      if(len < 80)
         clear_from(m_buf, len);

      assert(strlen(m_buf) >= 80);

      /* Look for new section
       */
      if(*m_buf != BLANK)
      {
         m_f0 = strtok(&m_buf[0], " ");

         assert(m_f0 != nullptr);

         m_f1 = strtok(nullptr, " ");

         return true;
      }

      if(!m_is_new_format)
      {
         /* Test for fixed format comments
          */
         if((m_buf[14] == '$') && (m_buf[13] == ' '))
            clear_from(m_buf, 14);
         else if((m_buf[39] == '$') && (m_buf[38] == ' '))
            clear_from(m_buf, 39);

         /* Test for fixed format
          */
         space = m_buf[12] | m_buf[13]
                 | m_buf[22] | m_buf[23]
                 | m_buf[36] | m_buf[37] | m_buf[38]
                 | m_buf[47] | m_buf[48]
                 | m_buf[61] | m_buf[62] | m_buf[63];

         if(space == BLANK || len < 13)
         {
            /* Now we have space at the right positions.
             * But are there also the non space where they
             * should be ?
             */
            bool number = isdigit(m_buf[24]) || isdigit(m_buf[25])
                          || isdigit(m_buf[26]) || isdigit(m_buf[27])
                          || isdigit(m_buf[28]) || isdigit(m_buf[29])
                          || isdigit(m_buf[30]) || isdigit(m_buf[31])
                          || isdigit(m_buf[32]) || isdigit(m_buf[33])
                          || isdigit(m_buf[34]) || isdigit(m_buf[35]);

            /* len < 13 is handle ROW lines with embedded spaces
             * in the names correctly
             */
            if(number || len < 13)
            {
               /* Now we assume fixed format, so we patch possible embedded spaces.
                */
               patch_field(m_buf,  4, 12);
               patch_field(m_buf, 14, 22);
               patch_field(m_buf, 39, 47);
            }
            else
            {
               if(m_section == COLUMNS || m_section == RHS
                     || m_section == RANGES  || m_section == BOUNDS)
                  m_is_new_format = true;
            }
         }
         else
         {
            m_is_new_format = true;
         }
      }

      s = &m_buf[1];

      /* At this point it is not clear if we have a indicator field.
       * If there is none (e.g. empty) f1 will be the first name field.
       * If there is one, f2 will be the first name field.
       *
       * Initially comment marks '$' ar only allowed in the beginning
       * of the 2nd and 3rd name field. We test all fields but the first.
       * This makes no difference, since if the $ is at the start of a value
       * field, the line will be errornous anyway.
       */
      do
      {
         if(nullptr == (m_f1 = strtok(s, " ")))
            break;

         if((nullptr == (m_f2 = strtok(nullptr, " "))) || (*m_f2 == '$'))
         {
            m_f2 = nullptr;
            break;
         }

         if(!strcmp(m_f2, "'MARKER'"))
            is_marker = true;

         if((nullptr == (m_f3 = strtok(nullptr, " "))) || (*m_f3 == '$'))
         {
            m_f3 = nullptr;
            break;
         }

         if(is_marker)
         {
            if(!strcmp(m_f3, "'INTORG'"))
               m_is_integer = true;
            else if(!strcmp(m_f3, "'INTEND'"))
               m_is_integer = false;
            else
               break; // unknown marker
         }

         if(!strcmp(m_f3, "'MARKER'"))
            is_marker = true;

         if((nullptr == (m_f4 = strtok(nullptr, " "))) || (*m_f4 == '$'))
         {
            m_f4 = nullptr;
            break;
         }

         if(is_marker)
         {
            if(!strcmp(m_f4, "'INTORG'"))
               m_is_integer = true;
            else if(!strcmp(m_f4, "'INTEND'"))
               m_is_integer = false;
            else
               break; // unknown marker
         }

         if((nullptr == (m_f5 = strtok(nullptr, " "))) || (*m_f5 == '$'))
            m_f5 = nullptr;
      }
      while(false);
   }
   while(is_marker);

   SPxOut::debug(this, "DMPSIN02 -----------------------------------------------\n"
                 "DMPSIN03 f0={}\n"
                 "DMPSIN04 f1={}\n"
                 "DMPSIN05 f2={}\n"
                 "DMPSIN07 f4={}\n"
                 "DMPSIN06 f3={}\n"
                 "DMPSIN08 f5={}\n"
                 "DMPSIN09 -----------------------------------------------\n",
                 ((m_f0 == nullptr) ? "nil" : m_f0),
                 ((m_f1 == nullptr) ? "nil" : m_f1),
                 ((m_f2 == nullptr) ? "nil" : m_f2),
                 ((m_f3 == nullptr) ? "nil" : m_f3),
                 ((m_f4 == nullptr) ? "nil" : m_f4),
                 ((m_f5 == nullptr) ? "nil" : m_f5));
   return true;
}